

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O0

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  undefined1 auStack_30 [4];
  int r;
  uv_lib_t lib;
  char *msg;
  char *dlerror_no_error;
  char *path;
  
  lib.handle = (void *)0x0;
  _auStack_30 = (void *)0x0;
  lib.errmsg = uv_dlerror((uv_lib_t *)auStack_30);
  if (lib.errmsg == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x25,"msg != NULL");
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"no error");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x26,"strstr(msg, dlerror_no_error) != NULL");
    abort();
  }
  iVar1 = uv_dlopen("test/fixtures/load_error.node",(uv_lib_t *)auStack_30);
  if (iVar1 != -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x29,"r == -1");
    abort();
  }
  lib.errmsg = uv_dlerror((uv_lib_t *)auStack_30);
  if (lib.errmsg == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x2c,"msg != NULL");
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"test/fixtures/load_error.node");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x2e,"strstr(msg, path) != NULL");
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"no error");
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x30,"strstr(msg, dlerror_no_error) == NULL");
    abort();
  }
  lib.errmsg = uv_dlerror((uv_lib_t *)auStack_30);
  if (lib.errmsg == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x34,"msg != NULL");
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"test/fixtures/load_error.node");
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x36,"strstr(msg, path) != NULL");
    abort();
  }
  pcVar2 = strstr(lib.errmsg,"no error");
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-dlerror.c"
            ,0x38,"strstr(msg, dlerror_no_error) == NULL");
    abort();
  }
  uv_dlclose((uv_lib_t *)auStack_30);
  return 0;
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
  ASSERT(strstr(msg, dlerror_no_error) != NULL);

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT(msg != NULL);
#ifndef __OpenBSD__
  ASSERT(strstr(msg, path) != NULL);
#endif
  ASSERT(strstr(msg, dlerror_no_error) == NULL);

  uv_dlclose(&lib);

  return 0;
}